

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DG2Dot.h
# Opt level: O1

void __thiscall
dg::debug::DG2Dot<dg::LLVMNode>::dumpBB
          (DG2Dot<dg::LLVMNode> *this,BBlock<dg::LLVMNode> *BB,int indent)

{
  ofstream *poVar1;
  _List_node_base *p_Var2;
  ostream *poVar3;
  int iVar4;
  
  poVar1 = &this->out;
  iVar4 = indent;
  if (indent < 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"/* Basic Block ",0xf);
    (**this->_vptr_DG2Dot)(this,poVar1,BB->key);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," [",2);
    poVar3 = std::ostream::_M_insert<void_const*>(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"] */\n",5);
LAB_00121774:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"subgraph cluster_bb_",0x14);
    poVar3 = std::ostream::_M_insert<void_const*>(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," {\n",3);
  }
  else {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"/* Basic Block ",0xf);
    (**this->_vptr_DG2Dot)(this,poVar1,BB->key);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," [",2);
    poVar3 = std::ostream::_M_insert<void_const*>(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"] */\n",5);
    iVar4 = indent;
    if (indent < 1) goto LAB_00121774;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"subgraph cluster_bb_",0x14);
    poVar3 = std::ostream::_M_insert<void_const*>(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," {\n",3);
    iVar4 = indent;
    if (indent < 1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"\tstyle=filled fillcolor=white\n",0x1e);
      goto LAB_001217f4;
    }
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"\tstyle=filled fillcolor=white\n",0x1e);
  iVar4 = indent;
  if (0 < indent) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
LAB_001217f4:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tlabel=\"",8);
  (**this->_vptr_DG2Dot)(this,poVar1,BB->key);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," [",2);
  poVar3 = std::ostream::_M_insert<void_const*>(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]",1);
  if ((BB->analysisAuxData).dfsorder != 0) {
    iVar4 = indent;
    if (0 < indent) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\\ndfs order: ",0xd);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  }
  if (BB->slice_id != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\\nslice: ",9);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\"\n",2);
  for (p_Var2 = (BB->nodes).super__List_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>.
                _M_impl._M_node.super__List_node_base._M_next;
      p_Var2 != (_List_node_base *)&BB->nodes; p_Var2 = p_Var2->_M_next) {
    iVar4 = indent;
    if (0 < indent) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tNODE",5);
    poVar3 = std::ostream::_M_insert<void_const*>(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," [shape=rect label=\"",0x14);
    poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"]\n",3);
  }
  if (0 < indent) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
      indent = indent + -1;
    } while (indent != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"} /* cluster_bb_",0x10);
  poVar3 = std::ostream::_M_insert<void_const*>(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," */\n\n",5);
  return;
}

Assistant:

void dumpBB(const BBlock<NodeT> *BB, int indent) {
        Indent Ind(indent);

        out << Ind << "/* Basic Block ";
        printKey(out, BB->getKey());
        out << " [" << BB << "] */\n";
        out << Ind << "subgraph cluster_bb_" << BB << " {\n";
        out << Ind << "\tstyle=filled fillcolor=white\n";
        out << Ind << "\tlabel=\"";

        printKey(out, BB->getKey());
        out << " [" << BB << "]";

        unsigned int dfsorder = BB->getDFSOrder();
        if (dfsorder != 0)
            out << Ind << "\\ndfs order: " << dfsorder;

        uint64_t slice_id = BB->getSlice();
        if (slice_id != 0)
            out << "\\nslice: " << slice_id;

        out << "\"\n";

        for (NodeT *n : BB->getNodes()) {
            // print nodes in BB, edges will be printed later
            out << Ind << "\tNODE" << n << " [shape=rect label=\""
                << n->getKey() << "\"]\n";
        }

        out << Ind << "} /* cluster_bb_" << BB << " */\n\n";
    }